

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

Vec_Wrd_t * Gia_ManSimCombine(int nInputs,Vec_Wrd_t *vBase,Vec_Wrd_t *vAddOn,int nWordsUse)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  Vec_Wrd_t *p;
  word *pwVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  word *pwVar10;
  ulong uVar11;
  long lVar12;
  
  iVar1 = vBase->nSize;
  uVar3 = (long)iVar1 / (long)nInputs;
  iVar2 = vAddOn->nSize;
  iVar5 = iVar2 / nInputs;
  iVar4 = (int)uVar3;
  iVar9 = (iVar4 + nWordsUse) * nInputs;
  p = (Vec_Wrd_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar7 = iVar9;
  }
  p->nSize = 0;
  p->nCap = iVar7;
  if (iVar7 == 0) {
    pwVar6 = (word *)0x0;
  }
  else {
    pwVar6 = (word *)malloc((long)iVar7 << 3);
  }
  p->pArray = pwVar6;
  if (iVar1 % nInputs != 0) {
    __assert_fail("Vec_WrdSize(vBase) % nInputs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x109,"Vec_Wrd_t *Gia_ManSimCombine(int, Vec_Wrd_t *, Vec_Wrd_t *, int)");
  }
  if (iVar2 % nInputs != 0) {
    __assert_fail("Vec_WrdSize(vAddOn) % nInputs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x10a,"Vec_Wrd_t *Gia_ManSimCombine(int, Vec_Wrd_t *, Vec_Wrd_t *, int)");
  }
  if (iVar5 < nWordsUse) {
    __assert_fail("nWordsUse <= nWordsAddOn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x10b,"Vec_Wrd_t *Gia_ManSimCombine(int, Vec_Wrd_t *, Vec_Wrd_t *, int)");
  }
  if (0 < nInputs) {
    uVar8 = 0;
    do {
      if (iVar4 == 0) {
        pwVar6 = (word *)0x0;
      }
      else {
        lVar12 = uVar8 * (long)iVar4;
        if ((lVar12 < 0) || (vBase->nSize <= lVar12)) goto LAB_007c7ce5;
        pwVar6 = vBase->pArray + lVar12;
      }
      if (iVar5 == 0) {
        pwVar10 = (word *)0x0;
      }
      else {
        lVar12 = uVar8 * (long)iVar5;
        if ((lVar12 < 0) || (vAddOn->nSize <= lVar12)) {
LAB_007c7ce5:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pwVar10 = vAddOn->pArray + lVar12;
      }
      if (0 < iVar4) {
        uVar11 = 0;
        do {
          Vec_WrdPush(p,pwVar6[uVar11]);
          uVar11 = uVar11 + 1;
        } while ((uVar3 & 0xffffffff) != uVar11);
      }
      if (0 < nWordsUse) {
        uVar11 = 0;
        do {
          Vec_WrdPush(p,pwVar10[uVar11]);
          uVar11 = uVar11 + 1;
        } while ((uint)nWordsUse != uVar11);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)nInputs);
  }
  if ((0xf < p->nSize) && (p->nSize != p->nCap)) {
    __assert_fail("Vec_WrdSize(vSimsIn) == Vec_WrdCap(vSimsIn) || Vec_WrdSize(vSimsIn) < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x115,"Vec_Wrd_t *Gia_ManSimCombine(int, Vec_Wrd_t *, Vec_Wrd_t *, int)");
  }
  return p;
}

Assistant:

Vec_Wrd_t * Gia_ManSimCombine( int nInputs, Vec_Wrd_t * vBase, Vec_Wrd_t * vAddOn, int nWordsUse )
{
    int nWordsBase  = Vec_WrdSize(vBase)  / nInputs;
    int nWordsAddOn = Vec_WrdSize(vAddOn) / nInputs; int i, w;
    Vec_Wrd_t * vSimsIn = Vec_WrdAlloc( nInputs * (nWordsBase + nWordsUse) );
    assert( Vec_WrdSize(vBase)  % nInputs == 0 );
    assert( Vec_WrdSize(vAddOn) % nInputs == 0 );
    assert( nWordsUse <= nWordsAddOn );
    for ( i = 0; i < nInputs; i++ )
    {
        word * pSimsB = nWordsBase  ? Vec_WrdEntryP( vBase,  i * nWordsBase )  : NULL;
        word * pSimsA = nWordsAddOn ? Vec_WrdEntryP( vAddOn, i * nWordsAddOn ) : NULL;
        for ( w = 0; w < nWordsBase; w++ )
            Vec_WrdPush( vSimsIn, pSimsB[w] );
        for ( w = 0; w < nWordsUse; w++ )
            Vec_WrdPush( vSimsIn, pSimsA[w] );
    }
    assert( Vec_WrdSize(vSimsIn) == Vec_WrdCap(vSimsIn) || Vec_WrdSize(vSimsIn) < 16 );
    return vSimsIn;
}